

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address.cpp
# Opt level: O2

result<sockpp::inet_address> *
sockpp::inet_address::create
          (result<sockpp::inet_address> *__return_storage_ptr__,string *saddr,in_port_t port)

{
  result<unsigned_int> res;
  allocator<char> local_59;
  result<unsigned_int> local_58;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,(saddr->_M_dataplus)._M_p,&local_59);
  resolve_name(&local_58,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  if (local_58.err_._M_value == 0) {
    local_40._10_2_ = port << 8 | port >> 8;
    local_40._0_8_ = &PTR__sock_address_0010dac0;
    local_40._8_2_ = 2;
    local_40._12_4_ = local_58.val_;
    local_30._M_allocated_capacity = 0;
    result<sockpp::inet_address>::result(__return_storage_ptr__,(inet_address *)local_40);
  }
  else {
    (__return_storage_ptr__->val_).super_sock_address._vptr_sock_address =
         (_func_int **)&PTR__sock_address_0010dac0;
    (__return_storage_ptr__->val_).addr_.sin_family = 0;
    (__return_storage_ptr__->val_).addr_.sin_port = 0;
    (__return_storage_ptr__->val_).addr_.sin_addr = 0;
    (__return_storage_ptr__->val_).addr_.sin_zero[0] = '\0';
    (__return_storage_ptr__->val_).addr_.sin_zero[1] = '\0';
    (__return_storage_ptr__->val_).addr_.sin_zero[2] = '\0';
    (__return_storage_ptr__->val_).addr_.sin_zero[3] = '\0';
    (__return_storage_ptr__->val_).addr_.sin_zero[4] = '\0';
    (__return_storage_ptr__->val_).addr_.sin_zero[5] = '\0';
    (__return_storage_ptr__->val_).addr_.sin_zero[6] = '\0';
    (__return_storage_ptr__->val_).addr_.sin_zero[7] = '\0';
    *(ulong *)&__return_storage_ptr__->err_ = CONCAT44(local_58.err_._4_4_,local_58.err_._M_value);
    (__return_storage_ptr__->err_)._M_cat = local_58.err_._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

result<inet_address> inet_address::create(const string& saddr, in_port_t port) noexcept {
    auto res = resolve_name(saddr.c_str());
    if (!res)
        return res.error();

    auto addr = sockaddr_in{};
    addr.sin_family = AF_INET;
    addr.sin_addr.s_addr = res.value();
    addr.sin_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr.sin_len = (uint8_t)SZ;
#endif
    return inet_address{addr};
}